

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNetlist.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkToLogic(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  long *plVar1;
  long *plVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  char *pName;
  Vec_Ptr_t *pVVar5;
  Abc_Ntk_t *pAVar6;
  long lVar7;
  long lVar8;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    if (pNtk->ntkType == ABC_NTK_STRASH) {
      pAVar4 = Abc_NtkAigToLogicSop(pNtk);
      return pAVar4;
    }
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNetlist.c"
                  ,0x3c,"Abc_Ntk_t *Abc_NtkToLogic(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNetlist.c"
                  ,0x3f,"Abc_Ntk_t *Abc_NtkToLogic(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[10] == 0) {
    pAVar4 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,pNtk->ntkFunc);
    pVVar5 = pNtk->vObjs;
    if (0 < pVVar5->nSize) {
      lVar7 = 0;
      do {
        pObj = (Abc_Obj_t *)pVVar5->pArray[lVar7];
        if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
          Abc_NtkDupObj(pAVar4,pObj,0);
          pObj_00 = (pObj->field_6).pCopy;
          pName = Abc_ObjName((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanouts).pArray]);
          Abc_ObjAssignName(pObj_00,pName,(char *)0x0);
        }
        lVar7 = lVar7 + 1;
        pVVar5 = pNtk->vObjs;
      } while (lVar7 < pVVar5->nSize);
    }
    pVVar5 = pNtk->vObjs;
    if (0 < pVVar5->nSize) {
      lVar7 = 0;
      do {
        plVar1 = (long *)pVVar5->pArray[lVar7];
        if (((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 7)) &&
           (0 < *(int *)((long)plVar1 + 0x1c))) {
          lVar8 = 0;
          do {
            plVar2 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)(plVar1[4] + lVar8 * 4) * 8);
            Abc_ObjAddFanin((Abc_Obj_t *)plVar1[8],
                            *(Abc_Obj_t **)
                             (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                       (long)*(int *)plVar2[4] * 8) + 0x40));
            lVar8 = lVar8 + 1;
          } while (lVar8 < *(int *)((long)plVar1 + 0x1c));
        }
        lVar7 = lVar7 + 1;
        pVVar5 = pNtk->vObjs;
      } while (lVar7 < pVVar5->nSize);
    }
    Abc_NtkFinalize(pNtk,pAVar4);
    Abc_NtkLogicMakeSimpleCos(pAVar4,0);
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar6 = Abc_NtkToLogic(pNtk->pExdc);
      pAVar4->pExdc = pAVar6;
    }
    iVar3 = Abc_NtkCheck(pAVar4);
    if (iVar3 == 0) {
      fwrite("Abc_NtkToLogic(): Network check has failed.\n",0x2c,1,_stdout);
    }
    return pAVar4;
  }
  __assert_fail("Abc_NtkBlackboxNum(pNtk) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNetlist.c"
                ,0x40,"Abc_Ntk_t *Abc_NtkToLogic(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkToLogic( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    // consider the case of the AIG
    if ( Abc_NtkIsStrash(pNtk) )
        return Abc_NtkAigToLogicSop( pNtk );
    assert( Abc_NtkIsNetlist(pNtk) );
    // consider simple case when there is hierarchy
//    assert( pNtk->pDesign == NULL );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    assert( Abc_NtkBlackboxNum(pNtk) == 0 );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, pNtk->ntkFunc );
    // duplicate the nodes 
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Abc_NtkDupObj(pNtkNew, pObj, 0);
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(Abc_ObjFanout0(pObj)), NULL );
    }
    // reconnect the internal nodes in the new network
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFanin0(pFanin)->pCopy );
    // collect the CO nodes
    Abc_NtkFinalize( pNtk, pNtkNew );
    // fix the problem with CO pointing directly to CIs
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkToLogic( pNtk->pExdc );
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkToLogic(): Network check has failed.\n" );
    return pNtkNew;
}